

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSymmetry.cpp
# Opt level: O3

HighsInt __thiscall StabilizerOrbits::orbitalFixing(StabilizerOrbits *this,HighsDomain *domain)

{
  double *pdVar1;
  double dVar2;
  uint uVar3;
  pointer pHVar4;
  pointer pHVar5;
  undefined1 auVar6 [16];
  pointer piVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  HighsInt j;
  long lVar15;
  HighsDomainChange boundchg;
  int local_48;
  
  local_48 = HighsSymmetries::propagateOrbitopes(this->symmetries,domain);
  if (((domain->infeasible_ != false) ||
      ((this->orbitCols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start ==
       (this->orbitCols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish)) ||
     (iVar9 = (int)((ulong)((long)(this->orbitStarts).super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->orbitStarts).super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_start) >> 2) + -1, iVar9 < 1)) {
    return local_48;
  }
  iVar13 = 0;
  do {
    lVar11 = (long)iVar13;
    piVar7 = (this->orbitStarts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar15 = (long)piVar7[lVar11];
    iVar8 = iVar13 + 1;
    if (piVar7[lVar11] < piVar7[lVar11 + 1]) {
      lVar12 = lVar15;
      do {
        iVar14 = (this->orbitCols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar12];
        dVar2 = (domain->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[iVar14];
        pdVar1 = (domain->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start + iVar14;
        if ((dVar2 == *pdVar1) && (!NAN(dVar2) && !NAN(*pdVar1))) {
          if (iVar14 != -1) {
            pHVar4 = (domain->domchgstack_).
                     super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
            pHVar5 = (domain->domchgstack_).
                     super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            iVar14 = local_48;
            if ((dVar2 != 1.0) || (NAN(dVar2))) {
              do {
                uVar3 = (this->orbitCols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar15];
                dVar2 = (domain->col_upper_).super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start[(int)uVar3];
                if ((dVar2 != 0.0) || (NAN(dVar2))) {
                  iVar14 = iVar14 + 1;
                  auVar6._8_8_ = 0;
                  auVar6._0_8_ = (ulong)uVar3 + 0x100000000;
                  HighsDomain::changeBound
                            (domain,(HighsDomainChange)(auVar6 << 0x40),(Reason)0xfffffffe);
                  if (domain->infeasible_ != false) {
                    return iVar14;
                  }
                  piVar7 = (this->orbitStarts).super__Vector_base<int,_std::allocator<int>_>._M_impl
                           .super__Vector_impl_data._M_start;
                }
                lVar15 = lVar15 + 1;
              } while (lVar15 < piVar7[lVar11 + 1]);
            }
            else {
              do {
                iVar10 = (this->orbitCols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar15];
                dVar2 = (domain->col_lower_).super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start[iVar10];
                if ((dVar2 != 1.0) || (NAN(dVar2))) {
                  iVar14 = iVar14 + 1;
                  boundchg.column = iVar10;
                  boundchg.boundval = 1.0;
                  boundchg.boundtype = kLower;
                  HighsDomain::changeBound(domain,boundchg,(Reason)0xfffffffe);
                  if (domain->infeasible_ != false) {
                    return iVar14;
                  }
                  piVar7 = (this->orbitStarts).super__Vector_base<int,_std::allocator<int>_>._M_impl
                           .super__Vector_impl_data._M_start;
                }
                lVar15 = lVar15 + 1;
              } while (lVar15 < piVar7[lVar11 + 1]);
            }
            iVar10 = iVar14 - local_48;
            if (iVar14 != local_48) {
              HighsDomain::propagate(domain);
              if (domain->infeasible_ != false) {
                return iVar14;
              }
              iVar8 = iVar13 + 1;
              local_48 = iVar14;
              if (iVar10 < (int)((ulong)((long)(domain->domchgstack_).
                                               super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)(domain->domchgstack_).
                                              super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
                                              ._M_impl.super__Vector_impl_data._M_start) >> 4) -
                           (int)((ulong)((long)pHVar4 - (long)pHVar5) >> 4)) {
                iVar8 = 0;
              }
            }
          }
          break;
        }
        lVar12 = lVar12 + 1;
      } while (piVar7[lVar11 + 1] != lVar12);
    }
    iVar13 = iVar8;
    if (iVar9 <= iVar13) {
      return local_48;
    }
  } while( true );
}

Assistant:

HighsInt StabilizerOrbits::orbitalFixing(HighsDomain& domain) const {
  HighsInt numFixed = symmetries->propagateOrbitopes(domain);
  if (domain.infeasible() || orbitCols.empty()) return numFixed;

  HighsInt numOrbits = orbitStarts.size() - 1;
  for (HighsInt i = 0; i < numOrbits; ++i) {
    HighsInt fixcol = -1;
    for (HighsInt j = orbitStarts[i]; j < orbitStarts[i + 1]; ++j) {
      if (domain.isFixed(orbitCols[j])) {
        fixcol = orbitCols[j];
        break;
      }
    }

    if (fixcol != -1) {
      HighsInt oldNumFixed = numFixed;
      auto oldSize = domain.getDomainChangeStack().size();
      if (domain.col_lower_[fixcol] == 1.0) {
        for (HighsInt j = orbitStarts[i]; j < orbitStarts[i + 1]; ++j) {
          if (domain.col_lower_[orbitCols[j]] == 1.0) continue;
          ++numFixed;
          domain.changeBound(HighsBoundType::kLower, orbitCols[j], 1.0,
                             HighsDomain::Reason::unspecified());
          if (domain.infeasible()) return numFixed;
        }
      } else {
        for (HighsInt j = orbitStarts[i]; j < orbitStarts[i + 1]; ++j) {
          if (domain.col_upper_[orbitCols[j]] == 0.0) continue;
          ++numFixed;
          domain.changeBound(HighsBoundType::kUpper, orbitCols[j], 0.0,
                             HighsDomain::Reason::unspecified());
          if (domain.infeasible()) return numFixed;
        }
      }

      HighsInt newFixed = numFixed - oldNumFixed;

      if (newFixed != 0) {
        domain.propagate();
        if (domain.infeasible()) return numFixed;
        if ((HighsInt)(domain.getDomainChangeStack().size() - oldSize) >
            newFixed)
          i = -1;
      }
    }
  }

  return numFixed;
}